

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

void luaG_runerror(lua_State *L,char *fmt,...)

{
  CallInfo *ci;
  TString *src;
  long lVar1;
  char in_AL;
  int line;
  char *msg;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  ci = L->ci;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  argp[0].reg_save_area = local_d8;
  argp[0].overflow_arg_area = &stack0x00000008;
  argp[0].gp_offset = 0x10;
  argp[0].fp_offset = 0x30;
  msg = luaO_pushvfstring(L,fmt,argp);
  if (msg == (char *)0x0) {
    luaD_throw(L,'\x04');
  }
  if ((ci->callstatus & 0x8000) == 0) {
    src = *(TString **)(*(long *)((((ci->func).p)->val).value_.f + 0x18) + 0x70);
    line = getcurrentline(ci);
    luaG_addinfo(L,msg,src,line);
    lVar1 = (L->top).offset;
    *(undefined8 *)(lVar1 + -0x20) = *(undefined8 *)(lVar1 + -0x10);
    *(undefined1 *)(lVar1 + -0x18) = *(undefined1 *)(lVar1 + -8);
    (L->top).p = (StkId)((L->top).offset + -0x10);
  }
  luaG_errormsg(L);
}

Assistant:

l_noret luaG_runerror (lua_State *L, const char *fmt, ...) {
  CallInfo *ci = L->ci;
  const char *msg;
  va_list argp;
  luaC_checkGC(L);  /* error message uses memory */
  va_start(argp, fmt);
  msg = luaO_pushvfstring(L, fmt, argp);  /* format message */
  va_end(argp);
  if (msg == NULL)  /* no memory to format message? */
    luaD_throw(L, LUA_ERRMEM);
  else if (isLua(ci)) {  /* Lua function? */
    /* add source:line information */
    luaG_addinfo(L, msg, ci_func(ci)->p->source, getcurrentline(ci));
    setobjs2s(L, L->top.p - 2, L->top.p - 1);  /* remove 'msg' */
    L->top.p--;
  }
  luaG_errormsg(L);
}